

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgstrs.c
# Opt level: O2

void zgstrs(trans_t trans,SuperMatrix *L,SuperMatrix *U,int *perm_c,int *perm_r,SuperMatrix *B,
           SuperLUStat_t *stat,int *info)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  doublecomplex *pdVar6;
  void *pvVar7;
  void *pvVar8;
  long lVar9;
  doublecomplex dVar10;
  doublecomplex dVar11;
  double dVar12;
  doublecomplex dVar13;
  double dVar14;
  double dVar15;
  undefined8 uVar16;
  int iVar17;
  doublecomplex *Mxvec;
  doublecomplex *addr;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  doublecomplex *pdVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  ulong n;
  long lVar25;
  int iVar26;
  double *pdVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  ulong uVar33;
  bool bVar34;
  float fVar35;
  long local_168;
  int ii;
  
  *info = 0;
  if (trans < (CONJ|TRANS)) {
    uVar3 = L->nrow;
    n = (ulong)uVar3;
    ii = 2;
    iVar17 = -2;
    if ((((-1 < (int)uVar3) && (uVar3 == L->ncol)) && (L->Stype == SLU_SC)) &&
       ((L->Dtype == SLU_Z && (L->Mtype == SLU_TRLU)))) {
      ii = 3;
      iVar17 = -3;
      if (((-1 < U->nrow) && ((U->nrow == U->ncol && (U->Stype == SLU_NC)))) &&
         ((U->Dtype == SLU_Z && (U->Mtype == SLU_TRU)))) {
        puVar5 = (uint *)B->Store;
        uVar29 = *puVar5;
        uVar22 = (ulong)uVar29;
        ii = 6;
        iVar17 = -6;
        if (((((int)uVar3 <= (int)uVar29) && (B->Stype == SLU_DN)) && (B->Dtype == SLU_Z)) &&
           (B->Mtype == SLU_GE)) {
          uVar3 = B->ncol;
          Mxvec = doublecomplexCalloc(n * (long)(int)uVar3);
          if (Mxvec == (doublecomplex *)0x0) {
            sprintf((char *)&ii,"%s at line %d in file %s\n","Malloc fails for local work[].",0x8d,
                    "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zgstrs.c"
                   );
            superlu_abort_and_exit((char *)&ii);
          }
          addr = doublecomplexMalloc(n);
          if (addr != (doublecomplex *)0x0) {
            pdVar6 = *(doublecomplex **)(puVar5 + 2);
            uVar18 = 0;
            if (0 < (int)uVar3) {
              uVar18 = (ulong)uVar3;
            }
            if (trans == NOTRANS) {
              pvVar7 = L->Store;
              lVar23 = *(long *)((long)pvVar7 + 8);
              pvVar8 = U->Store;
              lVar9 = *(long *)((long)pvVar8 + 8);
              pdVar21 = pdVar6;
              for (uVar19 = 0; uVar19 != uVar18; uVar19 = uVar19 + 1) {
                for (lVar24 = 0; n * 4 - lVar24 != 0; lVar24 = lVar24 + 4) {
                  iVar17 = *(int *)((long)perm_r + lVar24);
                  pdVar27 = (double *)((long)&pdVar21->r + lVar24 * 4);
                  dVar12 = pdVar27[1];
                  addr[iVar17].r = *pdVar27;
                  addr[iVar17].i = dVar12;
                }
                for (lVar24 = 0; n << 4 != lVar24; lVar24 = lVar24 + 0x10) {
                  puVar1 = (undefined8 *)((long)&addr->r + lVar24);
                  uVar16 = puVar1[1];
                  puVar2 = (undefined8 *)((long)&pdVar21->r + lVar24);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar16;
                }
                pdVar21 = pdVar21 + uVar22;
              }
              fVar35 = 0.0;
              local_168 = 0;
              while (uVar19 = (ulong)*(int *)((long)pvVar7 + 4), local_168 <= (long)uVar19) {
                lVar28 = (long)*(int *)(*(long *)((long)pvVar7 + 0x30) + local_168 * 4);
                iVar17 = *(int *)(*(long *)((long)pvVar7 + 0x20) + lVar28 * 4);
                iVar4 = *(int *)(*(long *)((long)pvVar7 + 0x20) + 4 + lVar28 * 4);
                iVar26 = iVar4 - iVar17;
                lVar24 = *(int *)(*(long *)((long)pvVar7 + 0x30) + 4 + local_168 * 4) - lVar28;
                iVar31 = (int)lVar24;
                uVar29 = iVar26 - iVar31;
                local_168 = local_168 + 1;
                fVar35 = (float)(int)(uVar3 * 8 * iVar31 * uVar29) +
                         fVar35 + (float)(int)(uVar3 * 4 * iVar31 * (iVar31 + -1));
                if (iVar31 == 1) {
                  for (uVar19 = 0; uVar19 != uVar18; uVar19 = uVar19 + 1) {
                    lVar25 = uVar19 * uVar22;
                    pdVar27 = (double *)
                              ((long)*(int *)(*(long *)((long)pvVar7 + 0x10) + lVar28 * 4) * 0x10 +
                              lVar23 + 0x18);
                    lVar24 = (long)iVar17;
                    while (lVar24 = lVar24 + 1, lVar24 < iVar4) {
                      lVar30 = (long)*(int *)(*(long *)((long)pvVar7 + 0x18) + lVar24 * 4);
                      dVar14 = pdVar6[lVar25 + lVar28].r;
                      dVar15 = pdVar6[lVar25 + lVar28].i;
                      dVar12 = pdVar6[lVar25 + lVar30].i -
                               (pdVar27[-1] * dVar15 + dVar14 * *pdVar27);
                      dVar10.i._0_4_ = SUB84(dVar12,0);
                      dVar10.r = pdVar6[lVar25 + lVar30].r -
                                 (pdVar27[-1] * dVar14 + -dVar15 * *pdVar27);
                      dVar10.i._4_4_ = (int)((ulong)dVar12 >> 0x20);
                      pdVar6[lVar25 + lVar30] = dVar10;
                      pdVar27 = pdVar27 + 2;
                    }
                  }
                }
                else {
                  lVar25 = (long)*(int *)(*(long *)((long)pvVar7 + 0x10) + lVar28 * 4);
                  uVar19 = 0;
                  if (0 < (int)uVar29) {
                    uVar19 = (ulong)uVar29;
                  }
                  for (uVar33 = 0; uVar33 != uVar18; uVar33 = uVar33 + 1) {
                    lVar32 = uVar33 * uVar22;
                    zlsolve(iVar26,iVar31,(doublecomplex *)(lVar25 * 0x10 + lVar23),
                            pdVar6 + lVar32 + lVar28);
                    zmatvec(iVar26,uVar29,iVar31,
                            (doublecomplex *)((lVar24 + lVar25) * 0x10 + lVar23),
                            pdVar6 + lVar32 + lVar28,Mxvec);
                    for (lVar30 = 0; uVar19 * 4 != lVar30; lVar30 = lVar30 + 4) {
                      lVar20 = (long)*(int *)(lVar30 + *(long *)((long)pvVar7 + 0x18) +
                                                       (long)(iVar17 + iVar31) * 4);
                      pdVar27 = (double *)((long)&Mxvec->r + lVar30 * 4);
                      dVar12 = pdVar6[lVar32 + lVar20].i - pdVar27[1];
                      dVar11.i._0_4_ = SUB84(dVar12,0);
                      dVar11.r = pdVar6[lVar32 + lVar20].r - *pdVar27;
                      dVar11.i._4_4_ = (int)((ulong)dVar12 >> 0x20);
                      pdVar6[lVar32 + lVar20] = dVar11;
                      puVar1 = (undefined8 *)((long)&Mxvec->r + lVar30 * 4);
                      *puVar1 = 0;
                      puVar1[1] = 0;
                    }
                  }
                }
              }
              for (; -1 < (int)uVar19; uVar19 = (ulong)((int)uVar19 - 1)) {
                iVar17 = *(int *)(*(long *)((long)pvVar7 + 0x30) + (uVar19 & 0xffffffff) * 4);
                lVar28 = (long)iVar17;
                iVar4 = *(int *)(*(long *)((long)pvVar7 + 0x30) + 4 + (uVar19 & 0xffffffff) * 4);
                iVar17 = iVar4 - iVar17;
                lVar24 = (long)*(int *)(*(long *)((long)pvVar7 + 0x10) + lVar28 * 4);
                if (iVar17 == 1) {
                  pdVar21 = pdVar6 + lVar28;
                  uVar33 = uVar18;
                  while (iVar31 = (int)uVar33, uVar33 = (ulong)(iVar31 - 1), iVar31 != 0) {
                    z_div(pdVar21,pdVar21,(doublecomplex *)(lVar24 * 0x10 + lVar23));
                    pdVar21 = pdVar21 + uVar22;
                  }
                }
                else {
                  iVar31 = *(int *)(*(long *)((long)pvVar7 + 0x20) + 4 + lVar28 * 4);
                  iVar26 = *(int *)(*(long *)((long)pvVar7 + 0x20) + lVar28 * 4);
                  pdVar21 = pdVar6 + lVar28;
                  uVar33 = uVar18;
                  while (bVar34 = uVar33 != 0, uVar33 = uVar33 - 1, bVar34) {
                    zusolve(iVar31 - iVar26,iVar17,(doublecomplex *)(lVar24 * 0x10 + lVar23),pdVar21
                           );
                    pdVar21 = pdVar21 + uVar22;
                  }
                }
                fVar35 = fVar35 + (float)(int)((iVar17 + 1) * uVar3 * 4 * iVar17);
                for (uVar33 = 0; uVar33 != uVar18; uVar33 = uVar33 + 1) {
                  lVar25 = uVar33 * uVar22;
                  lVar24 = lVar28;
                  while (lVar24 < iVar4) {
                    iVar17 = *(int *)(*(long *)((long)pvVar8 + 0x18) + 4 + lVar24 * 4);
                    iVar31 = *(int *)(*(long *)((long)pvVar8 + 0x18) + lVar24 * 4);
                    lVar30 = (long)iVar31;
                    pdVar27 = (double *)(lVar30 * 0x10 + lVar9 + 8);
                    for (; lVar30 < iVar17; lVar30 = lVar30 + 1) {
                      lVar32 = (long)*(int *)(*(long *)((long)pvVar8 + 0x10) + lVar30 * 4);
                      dVar14 = pdVar6[lVar25 + lVar24].r;
                      dVar15 = pdVar6[lVar25 + lVar24].i;
                      dVar12 = pdVar6[lVar25 + lVar32].i -
                               (pdVar27[-1] * dVar15 + dVar14 * *pdVar27);
                      dVar13.i._0_4_ = SUB84(dVar12,0);
                      dVar13.r = pdVar6[lVar25 + lVar32].r -
                                 (pdVar27[-1] * dVar14 + -dVar15 * *pdVar27);
                      dVar13.i._4_4_ = (int)((ulong)dVar12 >> 0x20);
                      pdVar6[lVar25 + lVar32] = dVar13;
                      pdVar27 = pdVar27 + 2;
                    }
                    fVar35 = fVar35 + (float)((iVar17 - iVar31) * 8);
                    lVar24 = lVar24 + 1;
                  }
                }
              }
              pdVar21 = pdVar6;
              for (uVar19 = 0; uVar19 != uVar18; uVar19 = uVar19 + 1) {
                for (lVar23 = 0; n * 4 != lVar23; lVar23 = lVar23 + 4) {
                  dVar12 = pdVar6[uVar19 * uVar22 + (long)*(int *)((long)perm_c + lVar23)].i;
                  pdVar27 = (double *)((long)&addr->r + lVar23 * 4);
                  *pdVar27 = pdVar6[uVar19 * uVar22 + (long)*(int *)((long)perm_c + lVar23)].r;
                  pdVar27[1] = dVar12;
                }
                for (lVar23 = 0; n << 4 != lVar23; lVar23 = lVar23 + 0x10) {
                  puVar1 = (undefined8 *)((long)&addr->r + lVar23);
                  uVar16 = puVar1[1];
                  puVar2 = (undefined8 *)((long)&pdVar21->r + lVar23);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar16;
                }
                pdVar21 = pdVar21 + uVar22;
              }
              stat->ops[0x11] = fVar35;
            }
            else {
              pdVar21 = pdVar6;
              for (uVar19 = 0; uVar19 != uVar18; uVar19 = uVar19 + 1) {
                for (lVar23 = 0; n * 4 != lVar23; lVar23 = lVar23 + 4) {
                  iVar17 = *(int *)((long)perm_c + lVar23);
                  pdVar27 = (double *)((long)&pdVar21->r + lVar23 * 4);
                  dVar12 = pdVar27[1];
                  addr[iVar17].r = *pdVar27;
                  addr[iVar17].i = dVar12;
                }
                for (lVar23 = 0; n << 4 != lVar23; lVar23 = lVar23 + 0x10) {
                  puVar1 = (undefined8 *)((long)&addr->r + lVar23);
                  uVar16 = puVar1[1];
                  puVar2 = (undefined8 *)((long)&pdVar21->r + lVar23);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar16;
                }
                pdVar21 = pdVar21 + uVar22;
              }
              stat->ops[0x11] = 0.0;
              pdVar21 = pdVar6;
              uVar19 = uVar18;
              if (trans == TRANS) {
                while (uVar19 != 0) {
                  sp_ztrsv("U","T","N",L,U,pdVar21,stat,info);
                  sp_ztrsv("L","T","U",L,U,pdVar21,stat,info);
                  pdVar21 = pdVar21 + uVar22;
                  uVar19 = uVar19 - 1;
                }
              }
              else {
                while (uVar19 != 0) {
                  sp_ztrsv("U","C","N",L,U,pdVar21,stat,info);
                  sp_ztrsv("L","C","U",L,U,pdVar21,stat,info);
                  pdVar21 = pdVar21 + uVar22;
                  uVar19 = uVar19 - 1;
                }
              }
              pdVar21 = pdVar6;
              for (uVar19 = 0; uVar19 != uVar18; uVar19 = uVar19 + 1) {
                for (lVar23 = 0; n * 4 != lVar23; lVar23 = lVar23 + 4) {
                  dVar12 = pdVar6[uVar19 * uVar22 + (long)*(int *)((long)perm_r + lVar23)].i;
                  pdVar27 = (double *)((long)&addr->r + lVar23 * 4);
                  *pdVar27 = pdVar6[uVar19 * uVar22 + (long)*(int *)((long)perm_r + lVar23)].r;
                  pdVar27[1] = dVar12;
                }
                for (lVar23 = 0; n << 4 != lVar23; lVar23 = lVar23 + 0x10) {
                  puVar1 = (undefined8 *)((long)&addr->r + lVar23);
                  uVar16 = puVar1[1];
                  puVar2 = (undefined8 *)((long)&pdVar21->r + lVar23);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar16;
                }
                pdVar21 = pdVar21 + uVar22;
              }
            }
            superlu_free(Mxvec);
            superlu_free(addr);
            return;
          }
          sprintf((char *)&ii,"%s at line %d in file %s\n","Malloc fails for local soln[].",0x8f,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zgstrs.c"
                 );
          superlu_abort_and_exit((char *)&ii);
        }
      }
    }
  }
  else {
    ii = 1;
    iVar17 = -1;
  }
  *info = iVar17;
  input_error("zgstrs",&ii);
  return;
}

Assistant:

void
zgstrs (trans_t trans, SuperMatrix *L, SuperMatrix *U,
        const int *perm_c, const int *perm_r, SuperMatrix *B,
        SuperLUStat_t *stat, int *info)
{

#ifdef _CRAY
    _fcd ftcs1, ftcs2, ftcs3, ftcs4;
#endif
#ifdef USE_VENDOR_BLAS
    doublecomplex   alpha = {1.0, 0.0}, beta = {1.0, 0.0};
    doublecomplex   *work_col;
#endif
    doublecomplex   temp_comp;
    DNformat *Bstore;
    doublecomplex   *Bmat;
    SCformat *Lstore;
    NCformat *Ustore;
    doublecomplex   *Lval, *Uval;
    int      fsupc, nrow, nsupr, nsupc, irow;
    int_t    i, j, k, luptr, istart, iptr;
    int      jcol, n, ldb, nrhs;
    doublecomplex   *work, *rhs_work, *soln;
    flops_t  solve_ops;
    void zprint_soln(int n, int nrhs, const doublecomplex *soln);

    /* Test input parameters ... */
    *info = 0;
    Bstore = B->Store;
    ldb = Bstore->lda;
    nrhs = B->ncol;
    if ( trans != NOTRANS && trans != TRANS && trans != CONJ ) *info = -1;
    else if ( L->nrow != L->ncol || L->nrow < 0 ||
	      L->Stype != SLU_SC || L->Dtype != SLU_Z || L->Mtype != SLU_TRLU )
	*info = -2;
    else if ( U->nrow != U->ncol || U->nrow < 0 ||
	      U->Stype != SLU_NC || U->Dtype != SLU_Z || U->Mtype != SLU_TRU )
	*info = -3;
    else if ( ldb < SUPERLU_MAX(0, L->nrow) ||
	      B->Stype != SLU_DN || B->Dtype != SLU_Z || B->Mtype != SLU_GE )
	*info = -6;
    if ( *info ) {
	int ii = -(*info);
	input_error("zgstrs", &ii);
	return;
    }

    n = L->nrow;
    work = doublecomplexCalloc((size_t) n * (size_t) nrhs);
    if ( !work ) ABORT("Malloc fails for local work[].");
    soln = doublecomplexMalloc((size_t) n);
    if ( !soln ) ABORT("Malloc fails for local soln[].");

    Bmat = Bstore->nzval;
    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;
    
    if ( trans == NOTRANS ) {
	/* Permute right hand sides to form Pr*B */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_r[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
	/* Forward solve PLy=Pb. */
	for (k = 0; k <= Lstore->nsuper; k++) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    nrow = nsupr - nsupc;

	    solve_ops += 4 * nsupc * (nsupc - 1) * nrhs;
	    solve_ops += 8 * nrow * nsupc * nrhs;
	    
	    if ( nsupc == 1 ) {
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
	    	    luptr = L_NZ_START(fsupc);
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); iptr++){
			irow = L_SUB(iptr);
			++luptr;
			zz_mult(&temp_comp, &rhs_work[fsupc], &Lval[luptr]);
			z_sub(&rhs_work[irow], &rhs_work[irow], &temp_comp);
		    }
		}
	    } else {
	    	luptr = L_NZ_START(fsupc);
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("N", strlen("N"));
		ftcs3 = _cptofcd("U", strlen("U"));
		CTRSM( ftcs1, ftcs1, ftcs2, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		CGEMM( ftcs2, ftcs2, &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#else
		ztrsm_("L", "L", "N", "U", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		zgemm_( "N", "N", &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#endif
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    work_col = &work[(size_t)j * (size_t)n];
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			z_sub(&rhs_work[irow], &rhs_work[irow], &work_col[i]);
			work_col[i].r = 0.0;
	                work_col[i].i = 0.0;
			iptr++;
		    }
		}
#else		
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    zlsolve (nsupr, nsupc, &Lval[luptr], &rhs_work[fsupc]);
		    zmatvec (nsupr, nrow, nsupc, &Lval[luptr+nsupc],
			    &rhs_work[fsupc], &work[0] );

		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			z_sub(&rhs_work[irow], &rhs_work[irow], &work[i]);
			work[i].r = 0.;
	                work[i].i = 0.;
			iptr++;
		    }
		}
#endif		    
	    } /* else ... */
	} /* for L-solve */

#if ( DEBUGlevel>=2 )
  	printf("After L-solve: y=\n");
	zprint_soln(n, nrhs, Bmat);
#endif

	/*
	 * Back solve Ux=y.
	 */
	for (k = Lstore->nsuper; k >= 0; k--) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    luptr = L_NZ_START(fsupc);

	    solve_ops += 4 * nsupc * (nsupc + 1) * nrhs;

	    if ( nsupc == 1 ) {
		rhs_work = &Bmat[0];
		for (j = 0; j < nrhs; j++) {
		    z_div(&rhs_work[fsupc], &rhs_work[fsupc], &Lval[luptr]);
		    rhs_work += ldb;
		}
	    } else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("U", strlen("U"));
		ftcs3 = _cptofcd("N", strlen("N"));
		CTRSM( ftcs1, ftcs2, ftcs3, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#else
		ztrsm_("L", "U", "N", "N", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#endif
#else		
		for (j = 0; j < nrhs; j++)
		    zusolve ( nsupr, nsupc, &Lval[luptr], &Bmat[(size_t)fsupc + (size_t)j * (size_t)ldb] );
#endif		
	    }

	    for (j = 0; j < nrhs; ++j) {
		rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		for (jcol = fsupc; jcol < fsupc + nsupc; jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++ ){
			irow = U_SUB(i);
			zz_mult(&temp_comp, &rhs_work[jcol], &Uval[i]);
			z_sub(&rhs_work[irow], &rhs_work[irow], &temp_comp);
		    }
		}
	    }
	    
	} /* for U-solve */

#if ( DEBUGlevel>=2 )
  	printf("After U-solve: x=\n");
	zprint_soln(n, nrhs, Bmat);
#endif

	/* Compute the final solution X := Pc*X. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_c[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
        stat->ops[SOLVE] = solve_ops;

    } else { /* Solve A'*X=B or CONJ(A)*X=B */
	/* Permute right hand sides to form Pc'*B. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_c[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

	stat->ops[SOLVE] = 0;
        if (trans == TRANS) {
	    for (k = 0; k < nrhs; ++k) {
	        /* Multiply by inv(U'). */
	        sp_ztrsv("U", "T", "N", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    
	        /* Multiply by inv(L'). */
	        sp_ztrsv("L", "T", "U", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    }
         } else { /* trans == CONJ */
            for (k = 0; k < nrhs; ++k) {                
                /* Multiply by conj(inv(U')). */
                sp_ztrsv("U", "C", "N", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
                
                /* Multiply by conj(inv(L')). */
                sp_ztrsv("L", "C", "U", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    }
         }
	/* Compute the final solution X := Pr'*X (=inv(Pr)*X) */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_r[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

    }

    SUPERLU_FREE(work);
    SUPERLU_FREE(soln);
}